

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  lyxp_node_type lVar1;
  lyxp_set_attrs *plVar2;
  undefined8 in_RAX;
  char *pcVar3;
  LY_ERR *pLVar4;
  int fake_cont;
  lyd_attr *plVar5;
  lyxp_node_type local_24 [2];
  lyxp_node_type root_type;
  
  local_24[0] = (lyxp_node_type)((ulong)in_RAX >> 0x20);
  plVar2 = (set->val).attrs;
  lVar1 = plVar2->type;
  if ((lVar1 != LYXP_NODE_ATTR) && (plVar5 = plVar2->attr, *(char *)&plVar5->next < '\0')) {
    ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar5,plVar5->parent->schema);
    return (char *)0x0;
  }
  moveto_get_root(cur_node,options,local_24);
  if (lVar1 < LYXP_NODE_ELEM) {
    plVar5 = plVar2->attr;
    fake_cont = 1;
  }
  else {
    if (1 < lVar1 - LYXP_NODE_ELEM) {
      if (lVar1 != LYXP_NODE_ATTR) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x221);
        return (char *)0x0;
      }
      pcVar3 = strdup(plVar2->attr->value_str);
      return pcVar3;
    }
    plVar5 = plVar2->attr;
    fake_cont = 0;
  }
  pcVar3 = cast_string_elem((lyd_node *)plVar5,param_3,fake_cont,local_24[0]);
  return pcVar3;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        return strdup(set->val.attrs[0].attr->value_str);
    }

    LOGINT;
    return NULL;
}